

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O0

void test_array_basic(void)

{
  int iVar1;
  VALUE_TYPE VVar2;
  int32_t iVar3;
  size_t sVar4;
  VALUE *pVVar5;
  VALUE *v;
  VALUE a;
  VALUE_TYPE in_stack_00000034;
  VALUE *in_stack_00000038;
  VALUE *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe4;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffffe5;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 uVar8;
  undefined1 in_stack_ffffffffffffffe7;
  undefined1 uVar9;
  VALUE *in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  VALUE *in_stack_fffffffffffffff8;
  
  iVar1 = value_init_array(in_stack_ffffffffffffffd8);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x26b,"%s","value_init_array(NULL) != 0");
  sVar4 = value_array_size(in_stack_ffffffffffffffd8);
  acutest_check_((int)(ulong)(sVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x26c,"%s","value_array_size(NULL) == 0");
  pVVar5 = value_array_get(in_stack_ffffffffffffffe8,
                           CONCAT17(in_stack_ffffffffffffffe7,
                                    CONCAT16(in_stack_ffffffffffffffe6,
                                             CONCAT15(in_stack_ffffffffffffffe5,
                                                      CONCAT14(in_stack_ffffffffffffffe4,
                                                               in_stack_ffffffffffffffe0)))));
  acutest_check_((int)(ulong)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x26d,"%s","value_array_get(NULL, 0) == NULL");
  pVVar5 = value_array_get_all(in_stack_ffffffffffffffd8);
  acutest_check_((int)(ulong)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x26e,"%s","value_array_get_all(NULL) == NULL");
  pVVar5 = value_array_append((VALUE *)CONCAT17(in_stack_ffffffffffffffe7,
                                                CONCAT16(in_stack_ffffffffffffffe6,
                                                         CONCAT15(in_stack_ffffffffffffffe5,
                                                                  CONCAT14(in_stack_ffffffffffffffe4
                                                                           ,
                                                  in_stack_ffffffffffffffe0)))));
  acutest_check_((int)(ulong)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x26f,"%s","value_array_append(NULL) == NULL");
  pVVar5 = value_array_insert(in_stack_ffffffffffffffe8,
                              CONCAT17(in_stack_ffffffffffffffe7,
                                       CONCAT16(in_stack_ffffffffffffffe6,
                                                CONCAT15(in_stack_ffffffffffffffe5,
                                                         CONCAT14(in_stack_ffffffffffffffe4,
                                                                  in_stack_ffffffffffffffe0)))));
  acutest_check_((int)(ulong)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x270,"%s","value_array_insert(NULL, 0) == NULL");
  pVVar5 = value_array_insert(in_stack_ffffffffffffffe8,
                              CONCAT17(in_stack_ffffffffffffffe7,
                                       CONCAT16(in_stack_ffffffffffffffe6,
                                                CONCAT15(in_stack_ffffffffffffffe5,
                                                         CONCAT14(in_stack_ffffffffffffffe4,
                                                                  in_stack_ffffffffffffffe0)))));
  acutest_check_((int)(ulong)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x271,"%s","value_array_insert(NULL, 123) == NULL");
  iVar1 = value_array_remove((VALUE *)CONCAT17(in_stack_ffffffffffffffe7,
                                               CONCAT16(in_stack_ffffffffffffffe6,
                                                        CONCAT15(in_stack_ffffffffffffffe5,
                                                                 CONCAT14(in_stack_ffffffffffffffe4,
                                                                          in_stack_ffffffffffffffe0)
                                                                ))),
                             (size_t)in_stack_ffffffffffffffd8);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x272,"%s","value_array_remove(NULL, 0) != 0");
  iVar1 = value_array_remove_range
                    (in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
                     (size_t)in_stack_ffffffffffffffe8);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x273,"%s","value_array_remove_range(NULL, 0, 123) != 0");
  value_array_clean((VALUE *)CONCAT17(in_stack_ffffffffffffffe7,
                                      CONCAT16(in_stack_ffffffffffffffe6,
                                               CONCAT15(in_stack_ffffffffffffffe5,
                                                        CONCAT14(in_stack_ffffffffffffffe4,
                                                                 in_stack_ffffffffffffffe0)))));
  value_init_array(in_stack_ffffffffffffffd8);
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_ARRAY),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x277,"%s","value_type(&a) == VALUE_ARRAY");
  iVar1 = value_is_compatible(in_stack_00000038,in_stack_00000034);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x278,"%s","!value_is_compatible(&a, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_00000038,in_stack_00000034);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x279,"%s","!value_is_compatible(&a, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_00000038,in_stack_00000034);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x27a,"%s","!value_is_compatible(&a, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_00000038,in_stack_00000034);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x27b,"%s","!value_is_compatible(&a, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_00000038,in_stack_00000034);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x27c,"%s","!value_is_compatible(&a, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_00000038,in_stack_00000034);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x27d,"%s","!value_is_compatible(&a, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_00000038,in_stack_00000034);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x27e,"%s","!value_is_compatible(&a, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_00000038,in_stack_00000034);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x27f,"%s","!value_is_compatible(&a, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_00000038,in_stack_00000034);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x280,"%s","value_is_compatible(&a, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_00000038,in_stack_00000034);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x281,"%s","!value_is_compatible(&a, VALUE_DICT)");
  sVar4 = value_array_size(in_stack_ffffffffffffffd8);
  acutest_check_((int)(ulong)(sVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x282,"%s","value_array_size(&a) == 0");
  pVVar5 = value_array_get(in_stack_ffffffffffffffe8,
                           CONCAT17(in_stack_ffffffffffffffe7,
                                    CONCAT16(in_stack_ffffffffffffffe6,
                                             CONCAT15(in_stack_ffffffffffffffe5,
                                                      CONCAT14(in_stack_ffffffffffffffe4,
                                                               in_stack_ffffffffffffffe0)))));
  acutest_check_((int)(ulong)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x283,"%s","value_array_get(&a, 0) == NULL");
  value_fini((VALUE *)0x10b1a7);
  value_init_array(in_stack_ffffffffffffffd8);
  pVVar5 = value_array_append((VALUE *)CONCAT17(in_stack_ffffffffffffffe7,
                                                CONCAT16(in_stack_ffffffffffffffe6,
                                                         CONCAT15(in_stack_ffffffffffffffe5,
                                                                  CONCAT14(in_stack_ffffffffffffffe4
                                                                           ,
                                                  in_stack_ffffffffffffffe0)))));
  acutest_check_((int)(ulong)(pVVar5 != (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x289,"%s","v != NULL");
  VVar2 = value_type(pVVar5);
  acutest_check_((int)(ulong)(VVar2 == VALUE_NULL),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x28a,"%s","value_type(v) == VALUE_NULL");
  iVar1 = value_is_new((VALUE *)CONCAT17(in_stack_ffffffffffffffe7,
                                         CONCAT16(in_stack_ffffffffffffffe6,
                                                  CONCAT15(in_stack_ffffffffffffffe5,
                                                           CONCAT14(in_stack_ffffffffffffffe4,
                                                                    in_stack_ffffffffffffffe0)))));
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x28b,"%s","value_is_new(v)");
  value_init_null(pVVar5);
  pVVar5 = value_array_get(pVVar5,CONCAT17(in_stack_ffffffffffffffe7,
                                           CONCAT16(in_stack_ffffffffffffffe6,
                                                    CONCAT15(in_stack_ffffffffffffffe5,
                                                             CONCAT14(in_stack_ffffffffffffffe4,
                                                                      in_stack_ffffffffffffffe0)))))
  ;
  iVar1 = value_is_new((VALUE *)CONCAT17(in_stack_ffffffffffffffe7,
                                         CONCAT16(in_stack_ffffffffffffffe6,
                                                  CONCAT15(in_stack_ffffffffffffffe5,
                                                           CONCAT14(in_stack_ffffffffffffffe4,
                                                                    in_stack_ffffffffffffffe0)))));
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x28e,"%s","!value_is_new(v)");
  pVVar5 = value_array_get(pVVar5,CONCAT17(in_stack_ffffffffffffffe7,
                                           CONCAT16(in_stack_ffffffffffffffe6,
                                                    CONCAT15(in_stack_ffffffffffffffe5,
                                                             CONCAT14(in_stack_ffffffffffffffe4,
                                                                      in_stack_ffffffffffffffe0)))))
  ;
  acutest_check_((int)(ulong)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x28f,"%s","value_array_get(&a, 1) == NULL");
  sVar4 = value_array_size(in_stack_ffffffffffffffd8);
  acutest_check_((int)(ulong)(sVar4 == 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x290,"%s","value_array_size(&a) == 1");
  value_fini((VALUE *)0x10b345);
  value_init_array(in_stack_ffffffffffffffd8);
  value_array_append((VALUE *)CONCAT17(in_stack_ffffffffffffffe7,
                                       CONCAT16(in_stack_ffffffffffffffe6,
                                                CONCAT15(in_stack_ffffffffffffffe5,
                                                         CONCAT14(in_stack_ffffffffffffffe4,
                                                                  in_stack_ffffffffffffffe0)))));
  value_init_int32(in_stack_ffffffffffffffd8,0);
  value_array_append((VALUE *)CONCAT17(in_stack_ffffffffffffffe7,
                                       CONCAT16(in_stack_ffffffffffffffe6,
                                                CONCAT15(in_stack_ffffffffffffffe5,
                                                         CONCAT14(in_stack_ffffffffffffffe4,
                                                                  in_stack_ffffffffffffffe0)))));
  value_init_int32(in_stack_ffffffffffffffd8,0);
  pVVar5 = value_array_append((VALUE *)CONCAT17(in_stack_ffffffffffffffe7,
                                                CONCAT16(in_stack_ffffffffffffffe6,
                                                         CONCAT15(in_stack_ffffffffffffffe5,
                                                                  CONCAT14(in_stack_ffffffffffffffe4
                                                                           ,
                                                  in_stack_ffffffffffffffe0)))));
  value_init_int32(in_stack_ffffffffffffffd8,0);
  pVVar5 = value_array_insert(pVVar5,CONCAT17(in_stack_ffffffffffffffe7,
                                              CONCAT16(in_stack_ffffffffffffffe6,
                                                       CONCAT15(in_stack_ffffffffffffffe5,
                                                                CONCAT14(in_stack_ffffffffffffffe4,
                                                                         in_stack_ffffffffffffffe0))
                                                      )));
  value_init_int32(in_stack_ffffffffffffffd8,0);
  sVar4 = value_array_size(in_stack_ffffffffffffffd8);
  acutest_check_((int)(ulong)(sVar4 == 4),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x29d,"%s","value_array_size(&a) == 4");
  pVVar5 = value_array_get(pVVar5,CONCAT17(in_stack_ffffffffffffffe7,
                                           CONCAT16(in_stack_ffffffffffffffe6,
                                                    CONCAT15(in_stack_ffffffffffffffe5,
                                                             CONCAT14(in_stack_ffffffffffffffe4,
                                                                      in_stack_ffffffffffffffe0)))))
  ;
  uVar9 = false;
  if (pVVar5 != (VALUE *)0x0) {
    iVar3 = value_int32(in_stack_fffffffffffffff8);
    uVar9 = iVar3 == 0;
  }
  acutest_check_((int)(ulong)(byte)uVar9,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x29f,"%s","v != NULL && value_int32(v) == 0");
  pVVar5 = value_array_get(pVVar5,CONCAT17(uVar9,CONCAT16(in_stack_ffffffffffffffe6,
                                                          CONCAT15(in_stack_ffffffffffffffe5,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffe4,
                                                  in_stack_ffffffffffffffe0)))));
  uVar8 = false;
  if (pVVar5 != (VALUE *)0x0) {
    iVar3 = value_int32(in_stack_fffffffffffffff8);
    uVar8 = iVar3 == 1;
  }
  acutest_check_((int)(ulong)(byte)uVar8,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x2a1,"%s","v != NULL && value_int32(v) == 1");
  pVVar5 = value_array_get(pVVar5,CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(in_stack_ffffffffffffffe5,
                                                                         CONCAT14(
                                                  in_stack_ffffffffffffffe4,
                                                  in_stack_ffffffffffffffe0)))));
  uVar7 = false;
  if (pVVar5 != (VALUE *)0x0) {
    iVar3 = value_int32(in_stack_fffffffffffffff8);
    uVar7 = iVar3 == 2;
  }
  acutest_check_((int)(ulong)(byte)uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x2a3,"%s","v != NULL && value_int32(v) == 2");
  pVVar5 = value_array_get(pVVar5,CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(uVar7,CONCAT14(
                                                  in_stack_ffffffffffffffe4,
                                                  in_stack_ffffffffffffffe0)))));
  uVar6 = false;
  if (pVVar5 != (VALUE *)0x0) {
    iVar3 = value_int32(in_stack_fffffffffffffff8);
    uVar6 = iVar3 == 3;
  }
  acutest_check_((int)(ulong)(byte)uVar6,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x2a5,"%s","v != NULL && value_int32(v) == 3");
  pVVar5 = value_array_get(pVVar5,CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(uVar7,CONCAT14(uVar6,
                                                  in_stack_ffffffffffffffe0)))));
  acutest_check_((int)(ulong)(pVVar5 == (VALUE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x2a7,"%s","v == NULL");
  value_array_clean((VALUE *)CONCAT17(uVar9,CONCAT16(uVar8,CONCAT15(uVar7,CONCAT14(uVar6,
                                                  in_stack_ffffffffffffffe0)))));
  sVar4 = value_array_size(in_stack_ffffffffffffffd8);
  acutest_check_((int)(ulong)(sVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x2a9,"%s","value_array_size(&a) == 0");
  value_fini((VALUE *)0x10b628);
  return;
}

Assistant:

static void
test_array_basic(void)
{
    VALUE a;
    VALUE* v;

    TEST_CHECK(value_init_array(NULL) != 0);
    TEST_CHECK(value_array_size(NULL) == 0);
    TEST_CHECK(value_array_get(NULL, 0) == NULL);
    TEST_CHECK(value_array_get_all(NULL) == NULL);
    TEST_CHECK(value_array_append(NULL) == NULL);
    TEST_CHECK(value_array_insert(NULL, 0) == NULL);
    TEST_CHECK(value_array_insert(NULL, 123) == NULL);
    TEST_CHECK(value_array_remove(NULL, 0) != 0);
    TEST_CHECK(value_array_remove_range(NULL, 0, 123) != 0);
    value_array_clean(NULL);

    value_init_array(&a);
    TEST_CHECK(value_type(&a) == VALUE_ARRAY);
    TEST_CHECK(!value_is_compatible(&a, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&a, VALUE_BOOL));
    TEST_CHECK(!value_is_compatible(&a, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(&a, VALUE_UINT32));
    TEST_CHECK(!value_is_compatible(&a, VALUE_INT64));
    TEST_CHECK(!value_is_compatible(&a, VALUE_UINT64));
    TEST_CHECK(!value_is_compatible(&a, VALUE_FLOAT));
    TEST_CHECK(!value_is_compatible(&a, VALUE_DOUBLE));
    TEST_CHECK(value_is_compatible(&a, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&a, VALUE_DICT));
    TEST_CHECK(value_array_size(&a) == 0);
    TEST_CHECK(value_array_get(&a, 0) == NULL);
    value_fini(&a);

    /* Check basic new value properties. */
    value_init_array(&a);
    v = value_array_append(&a);
    TEST_CHECK(v != NULL);
    TEST_CHECK(value_type(v) == VALUE_NULL);
    TEST_CHECK(value_is_new(v));
    value_init_null(v);
    v = value_array_get(&a, 0);
    TEST_CHECK(!value_is_new(v));
    TEST_CHECK(value_array_get(&a, 1) == NULL);
    TEST_CHECK(value_array_size(&a) == 1);
    value_fini(&a);

    /* Simple append/insert test. */
    value_init_array(&a);
    v = value_array_append(&a);
    value_init_int32(v, 1);
    v = value_array_append(&a);
    value_init_int32(v, 2);
    v = value_array_append(&a);
    value_init_int32(v, 3);
    v = value_array_insert(&a, 0);
    value_init_int32(v, 0);
    TEST_CHECK(value_array_size(&a) == 4);
    v = value_array_get(&a, 0);
    TEST_CHECK(v != NULL && value_int32(v) == 0);
    v = value_array_get(&a, 1);
    TEST_CHECK(v != NULL && value_int32(v) == 1);
    v = value_array_get(&a, 2);
    TEST_CHECK(v != NULL && value_int32(v) == 2);
    v = value_array_get(&a, 3);
    TEST_CHECK(v != NULL && value_int32(v) == 3);
    v = value_array_get(&a, 4);
    TEST_CHECK(v == NULL);
    value_array_clean(&a);
    TEST_CHECK(value_array_size(&a) == 0);
    value_fini(&a);
}